

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

bool __thiscall cppcms::widgets::file::validate(file *this)

{
  uint *puVar1;
  _func_int *p_Var2;
  long lVar3;
  long lVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  istream *piVar9;
  ulong uVar10;
  uint uVar11;
  string magic;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_59;
  string local_58;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  p_Var2 = (this->super_base_html_input)._vptr_base_html_input[-3];
  uVar11 = *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var2);
  if ((uVar11 & 2) == 0) {
    if (((this->super_base_html_input).field_0x80 & 2) != 0) {
      *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var2) = uVar11 & 0xfffffffc;
      return false;
    }
    *(uint *)(&(this->super_base_html_input).field_0x1f0 + (long)p_Var2) = uVar11 | 1;
    return true;
  }
  if ((uVar11 & 1) == 0) {
    return false;
  }
  if (((*(int *)&(this->super_base_html_input).field_0x34 == -1) &&
      (*(int *)&(this->super_base_html_input).field_0x30 == -1)) ||
     ((uVar8 = http::file::size(*(file **)&(this->super_base_html_input).field_0x88),
      uVar8 <= (ulong)(long)*(int *)&(this->super_base_html_input).field_0x34 &&
      (uVar10 = (ulong)*(int *)&(this->super_base_html_input).field_0x30,
      uVar10 <= uVar8 || uVar10 == 0xffffffffffffffff)))) {
    if (*(long *)&(this->super_base_html_input).field_0x58 != 0) {
      http::file::mime_abi_cxx11_(&local_58,*(file **)&(this->super_base_html_input).field_0x88);
      bVar5 = std::operator!=(&local_58,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(this->super_base_html_input).field_0x50);
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar5) goto LAB_0022795e;
    }
    cVar6 = booster::regex::empty();
    if (cVar6 == '\0') {
      http::file::mime_abi_cxx11_(&local_58,*(file **)&(this->super_base_html_input).field_0x88);
      bVar5 = booster::regex_match<booster::regex>
                        (&local_58,(regex *)&(this->super_base_html_input).field_0x70,0);
      std::__cxx11::string::~string((string *)&local_58);
      if (!bVar5) goto LAB_0022795e;
    }
    cVar6 = booster::regex::empty();
    if (cVar6 == '\0') {
      http::file::filename_abi_cxx11_(&local_58,*(file **)&(this->super_base_html_input).field_0x88)
      ;
      bVar5 = booster::regex_match<booster::regex>
                        (&local_58,(regex *)&(this->super_base_html_input).field_0x78,0);
      std::__cxx11::string::~string((string *)&local_58);
      if (!bVar5) goto LAB_0022795e;
    }
    if (((&(this->super_base_html_input).field_0x1f0)
         [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 1) != 0) {
      lVar3 = *(long *)&(this->super_base_html_input).field_0x38;
      lVar4 = *(long *)&(this->super_base_html_input).field_0x40;
      if (lVar3 == lVar4) {
        return true;
      }
      uVar8 = 0;
      for (uVar11 = 0; (ulong)uVar11 < (ulong)(lVar4 - lVar3 >> 5); uVar11 = uVar11 + 1) {
        uVar10 = *(ulong *)(lVar3 + 8 + (ulong)uVar11 * 0x20);
        if (uVar8 < uVar10) {
          uVar8 = uVar10;
        }
      }
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffffffffff00;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_38,uVar8 + 1,
                 (value_type_conflict *)&local_58,&local_59);
      piVar9 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
      std::istream::seekg(piVar9,0,0);
      piVar9 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
      std::istream::read((char *)piVar9,(long)local_38._M_impl.super__Vector_impl_data._M_start);
      piVar9 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,local_38._M_impl.super__Vector_impl_data._M_start,
                 local_38._M_impl.super__Vector_impl_data._M_start + *(long *)(piVar9 + 8));
      piVar9 = http::file::data(*(file **)&(this->super_base_html_input).field_0x88);
      uVar11 = 0;
      std::istream::seekg(piVar9,0,0);
      puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                       (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
      *puVar1 = *puVar1 & 0xfffffffe;
      do {
        lVar3 = *(long *)&(this->super_base_html_input).field_0x38;
        if ((ulong)(*(long *)&(this->super_base_html_input).field_0x40 - lVar3 >> 5) <=
            (ulong)uVar11) goto LAB_00227a6d;
        iVar7 = std::__cxx11::string::compare
                          ((ulong)&local_58,0,*(string **)(lVar3 + 8 + (ulong)uVar11 * 0x20));
        uVar11 = uVar11 + 1;
      } while (iVar7 != 0);
      puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                       (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
      *puVar1 = *puVar1 | 1;
LAB_00227a6d:
      std::__cxx11::string::~string((string *)&local_58);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
      return (bool)((&(this->super_base_html_input).field_0x1f0)
                    [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 1);
    }
  }
  else {
LAB_0022795e:
    puVar1 = (uint *)(&(this->super_base_html_input).field_0x1f0 +
                     (long)(this->super_base_html_input)._vptr_base_html_input[-3]);
    *puVar1 = *puVar1 & 0xfffffffe;
  }
  return false;
}

Assistant:

bool file::validate()
{
	if(!set()) {
		if(check_non_empty_) {
			valid(false);
			return false;
		}
		else {
			valid(true);
			return true;
		}
	}
	if(!valid())
		return false;
	if(size_max_ != -1 || size_min_!= -1) {
		size_t file_size = file_->size();
		if(size_max_ != -1 && file_size > size_t(size_max_)) {
			valid(false);
			return false;
		}
		if(size_min_ != -1 && file_size < size_t(size_min_)) {
			valid(false);
			return false;
		}
	}
	if(!mime_string_.empty() && file_->mime()!=mime_string_) {
		valid(false);
		return false;
	}
	if(!mime_regex_.empty() && !booster::regex_match(file_->mime(),mime_regex_)){
		valid(false);
		return false;
	}
	if(!filename_regex_.empty() && !booster::regex_match(file_->filename(),filename_regex_)){
		valid(false);
		return false;
	}
	if(valid() && !magics_.empty()) {
		size_t size_max = 0;
		for(unsigned i=0;i<magics_.size();i++)
			size_max=std::max(magics_[i].size(),size_max);
		std::vector<char> buf(size_max+1,0);
		file_->data().seekg(0);
		file_->data().read(&buf.front(),size_max);
		std::string magic(&buf.front(),file_->data().gcount());
		file_->data().seekg(0);
		valid(false);
		for(unsigned i=0;i<magics_.size();i++) {
			if(magic.compare(0,magics_[i].size(),magics_[i])==0) {
				valid(true);
				break;
			}
		}
	}
	return valid();

}